

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O0

void __thiscall
re2::TestInstance::RunSearch
          (TestInstance *this,Engine type,StringPiece *orig_text,StringPiece *orig_context,
          Anchor anchor,Result *result)

{
  RE2 *this_00;
  StringPiece *pSVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  ostream *poVar5;
  iterator pcVar6;
  iterator pcVar7;
  iterator pcVar8;
  iterator pcVar9;
  ulong uVar10;
  ulong uVar11;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  Arg *local_4f0;
  bool local_4c9;
  StringPiece local_438;
  int local_424;
  Anchor local_420;
  int i_1;
  Anchor pcre_anchor;
  int consumed;
  Parser local_410;
  int local_404;
  Arg *pAStack_400;
  int i;
  Arg *a;
  Arg **argptr;
  undefined4 local_3e8;
  undefined1 local_3e0 [12];
  undefined1 local_3d0 [12];
  Anchor local_3bc;
  re2 local_3b8 [4];
  Anchor re_anchor;
  re2 local_398 [32];
  LogMessage local_378;
  LogMessage local_1e8;
  undefined1 auStack_68 [8];
  StringPiece context;
  StringPiece text;
  int local_3c;
  int nsubmatch;
  Result *result_local;
  Anchor anchor_local;
  StringPiece *orig_context_local;
  StringPiece *orig_text_local;
  Engine type_local;
  TestInstance *this_local;
  
  memset(result,0,0x118);
  if (this->regexp_ == (Regexp *)0x0) {
    result->skipped = true;
    return;
  }
  local_3c = this->num_captures_ + 1;
  if (0x11 < local_3c) {
    local_3c = 0x11;
  }
  context._8_8_ = orig_text->ptr_;
  auStack_68 = (undefined1  [8])orig_context->ptr_;
  context.ptr_ = *(char **)&orig_context->length_;
  switch(type) {
  case kEngineNFA:
    if (this->prog_ == (Prog *)0x0) {
      result->skipped = true;
    }
    else {
      bVar4 = Prog::SearchNFA(this->prog_,(StringPiece *)&context.length_,(StringPiece *)auStack_68,
                              anchor,this->kind_,result->submatch,local_3c);
      result->matched = bVar4;
      result->have_submatch = true;
    }
    break;
  case kEngineDFA:
    if (this->prog_ == (Prog *)0x0) {
      result->skipped = true;
    }
    else {
      bVar4 = Prog::SearchDFA(this->prog_,(StringPiece *)&context.length_,(StringPiece *)auStack_68,
                              anchor,this->kind_,(StringPiece *)0x0,&result->skipped,
                              (vector<int,_std::allocator<int>_> *)0x0);
      result->matched = bVar4;
    }
    break;
  case kEngineDFA1:
    if ((this->prog_ == (Prog *)0x0) || (this->rprog_ == (Prog *)0x0)) {
      result->skipped = true;
    }
    else {
      bVar4 = Prog::SearchDFA(this->prog_,(StringPiece *)&context.length_,(StringPiece *)auStack_68,
                              anchor,this->kind_,result->submatch,&result->skipped,
                              (vector<int,_std::allocator<int>_> *)0x0);
      result->matched = bVar4;
      if (((result->matched & 1U) != 0) &&
         (bVar4 = Prog::SearchDFA(this->rprog_,result->submatch,(StringPiece *)auStack_68,kAnchored,
                                  kLongestMatch,result->submatch,&result->skipped,
                                  (vector<int,_std::allocator<int>_> *)0x0), !bVar4)) {
        LogMessage::LogMessage
                  (&local_378,
                   "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
                   ,0x15c,2);
        poVar5 = LogMessage::stream(&local_378);
        poVar5 = std::operator<<(poVar5,"Reverse DFA inconsistency: ");
        CEscape_abi_cxx11_(local_398,this->regexp_str_);
        poVar5 = std::operator<<(poVar5,(string *)local_398);
        poVar5 = std::operator<<(poVar5," on ");
        CEscape_abi_cxx11_(local_3b8,(StringPiece *)&context.length_);
        std::operator<<(poVar5,(string *)local_3b8);
        std::__cxx11::string::~string((string *)local_3b8);
        std::__cxx11::string::~string((string *)local_398);
        LogMessage::~LogMessage(&local_378);
        result->matched = false;
      }
      result->have_submatch0 = true;
    }
    break;
  case kEngineOnePass:
    if ((((this->prog_ == (Prog *)0x0) || (anchor == kUnanchored)) ||
        (bVar4 = Prog::IsOnePass(this->prog_), !bVar4)) || (5 < local_3c)) {
      result->skipped = true;
    }
    else {
      bVar4 = Prog::SearchOnePass(this->prog_,(StringPiece *)&context.length_,
                                  (StringPiece *)auStack_68,anchor,this->kind_,result->submatch,
                                  local_3c);
      result->matched = bVar4;
      result->have_submatch = true;
    }
    break;
  case kEngineBitState:
    if (this->prog_ == (Prog *)0x0) {
      result->skipped = true;
    }
    else {
      bVar4 = Prog::SearchBitState
                        (this->prog_,(StringPiece *)&context.length_,(StringPiece *)auStack_68,
                         anchor,this->kind_,result->submatch,local_3c);
      result->matched = bVar4;
      result->have_submatch = true;
    }
    break;
  case kEngineRE2:
  case kEngineRE2a:
  case kEngineRE2b:
    if (this->re2_ != (RE2 *)0x0) {
      pcVar8 = StringPiece::end((StringPiece *)&context.length_);
      pcVar9 = StringPiece::end((StringPiece *)auStack_68);
      if (pcVar8 == pcVar9) {
        local_3bc = (Anchor)(anchor == kAnchored);
        if (this->kind_ == kFullMatch) {
          local_3bc = ANCHOR_BOTH;
        }
        this_00 = this->re2_;
        pcVar8 = StringPiece::begin((StringPiece *)&context.length_);
        pcVar9 = StringPiece::begin((StringPiece *)auStack_68);
        pcVar6 = StringPiece::end((StringPiece *)&context.length_);
        pcVar7 = StringPiece::begin((StringPiece *)auStack_68);
        bVar4 = RE2::Match(this_00,(StringPiece *)auStack_68,(int)pcVar8 - (int)pcVar9,
                           (int)pcVar6 - (int)pcVar7,local_3bc,result->submatch,local_3c);
        result->matched = bVar4;
        result->have_submatch = 0 < local_3c;
        break;
      }
    }
    result->skipped = true;
    break;
  case kEnginePCRE:
    if (this->re_ != (PCRE *)0x0) {
      pcVar8 = StringPiece::begin((StringPiece *)&context.length_);
      pcVar9 = StringPiece::begin((StringPiece *)auStack_68);
      if (pcVar8 == pcVar9) {
        pcVar8 = StringPiece::end((StringPiece *)&context.length_);
        pcVar9 = StringPiece::end((StringPiece *)auStack_68);
        if (pcVar8 == pcVar9) {
          pSVar1 = this->regexp_str_;
          StringPiece::StringPiece((StringPiece *)local_3d0,"\\s");
          s._12_4_ = 0;
          s.ptr_ = (char *)local_3d0._0_8_;
          s.length_ = local_3d0._8_4_;
          bVar4 = StringPiece::contains(pSVar1,s);
          if (bVar4) {
LAB_00152de3:
            StringPiece::StringPiece((StringPiece *)&argptr,"\v");
            s_01._12_4_ = 0;
            s_01.ptr_ = (char *)argptr;
            s_01.length_ = local_3e8;
            local_4c9 = StringPiece::contains((StringPiece *)&context.length_,s_01);
          }
          else {
            pSVar1 = this->regexp_str_;
            StringPiece::StringPiece((StringPiece *)local_3e0,"\\S");
            s_00._12_4_ = 0;
            s_00.ptr_ = (char *)local_3e0._0_8_;
            s_00.length_ = local_3e0._8_4_;
            bVar4 = StringPiece::contains(pSVar1,s_00);
            local_4c9 = false;
            if (bVar4) goto LAB_00152de3;
          }
          if (local_4c9 == false) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = (long)local_3c;
            uVar10 = SUB168(auVar2 * ZEXT816(8),0);
            if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
              uVar10 = 0xffffffffffffffff;
            }
            a = (Arg *)operator_new__(uVar10);
            uVar10 = (ulong)local_3c;
            auVar3._8_8_ = 0;
            auVar3._0_8_ = uVar10;
            uVar11 = SUB168(auVar3 * ZEXT816(0x10),0);
            if (SUB168(auVar3 * ZEXT816(0x10),8) != 0) {
              uVar11 = 0xffffffffffffffff;
            }
            pAStack_400 = (Arg *)operator_new__(uVar11);
            if (uVar10 != 0) {
              local_4f0 = pAStack_400;
              do {
                PCRE::Arg::Arg(local_4f0);
                local_4f0 = local_4f0 + 1;
              } while (local_4f0 != pAStack_400 + uVar10);
            }
            for (local_404 = 0; local_404 < local_3c; local_404 = local_404 + 1) {
              PCRE::Arg::Arg((Arg *)&pcre_anchor,result->submatch + local_404);
              pAStack_400[local_404].arg_ = _pcre_anchor;
              pAStack_400[local_404].parser_ = local_410;
              (&a->arg_)[local_404] = pAStack_400 + local_404;
            }
            local_420 = (Anchor)(anchor == kAnchored);
            if (this->kind_ == kFullMatch) {
              local_420 = ANCHOR_BOTH;
            }
            PCRE::ClearHitLimit(this->re_);
            bVar4 = PCRE::DoMatch(this->re_,(StringPiece *)&context.length_,local_420,&i_1,(Arg **)a
                                  ,local_3c);
            result->matched = bVar4;
            bVar4 = PCRE::HitLimit(this->re_);
            if (bVar4) {
              result->untrusted = true;
              if (a != (Arg *)0x0) {
                operator_delete__(a);
              }
              if (pAStack_400 != (Arg *)0x0) {
                operator_delete__(pAStack_400);
              }
            }
            else {
              result->have_submatch = true;
              for (local_424 = 0; local_424 < local_3c; local_424 = local_424 + 1) {
                pcVar8 = StringPiece::begin(result->submatch + local_424);
                pcVar9 = StringPiece::begin((StringPiece *)&context.length_);
                if (pcVar8 == pcVar9 + -1) {
                  StringPiece::StringPiece(&local_438,(char *)0x0);
                  result->submatch[local_424].ptr_ = local_438.ptr_;
                  result->submatch[local_424].length_ = local_438.length_;
                }
              }
              if (a != (Arg *)0x0) {
                operator_delete__(a);
              }
              if (pAStack_400 != (Arg *)0x0) {
                operator_delete__(pAStack_400);
              }
            }
          }
          else {
            result->skipped = true;
          }
          break;
        }
      }
    }
    result->skipped = true;
    break;
  default:
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,300);
    poVar5 = LogMessage::stream(&local_1e8);
    poVar5 = std::operator<<(poVar5,"Bad RunSearch type: ");
    std::ostream::operator<<(poVar5,type);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1e8);
  case kEngineBacktrack:
    if (this->prog_ == (Prog *)0x0) {
      result->skipped = true;
    }
    else {
      bVar4 = Prog::UnsafeSearchBacktrack
                        (this->prog_,(StringPiece *)&context.length_,(StringPiece *)auStack_68,
                         anchor,this->kind_,result->submatch,local_3c);
      result->matched = bVar4;
      result->have_submatch = true;
    }
  }
  if ((result->matched & 1U) == 0) {
    memset(result->submatch,0,0x110);
  }
  return;
}

Assistant:

void TestInstance::RunSearch(Engine type,
                             const StringPiece& orig_text,
                             const StringPiece& orig_context,
                             Prog::Anchor anchor,
                             Result *result) {
  memset(result, 0, sizeof *result);
  if (regexp_ == NULL) {
    result->skipped = true;
    return;
  }
  int nsubmatch = 1 + num_captures_;  // NumCaptures doesn't count $0
  if (nsubmatch > kMaxSubmatch)
    nsubmatch = kMaxSubmatch;

  StringPiece text = orig_text;
  StringPiece context = orig_context;

  switch (type) {
    default:
      LOG(FATAL) << "Bad RunSearch type: " << (int)type;

    case kEngineBacktrack:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->UnsafeSearchBacktrack(text, context, anchor, kind_,
                                     result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineNFA:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->SearchNFA(text, context, anchor, kind_,
                        result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineDFA:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchDFA(text, context, anchor, kind_, NULL,
                                         &result->skipped, NULL);
      break;

    case kEngineDFA1:
      if (prog_ == NULL || rprog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched =
        prog_->SearchDFA(text, context, anchor, kind_, result->submatch,
                         &result->skipped, NULL);
      // If anchored, no need for second run,
      // but do it anyway to find more bugs.
      if (result->matched) {
        if (!rprog_->SearchDFA(result->submatch[0], context,
                               Prog::kAnchored, Prog::kLongestMatch,
                               result->submatch,
                               &result->skipped, NULL)) {
          LOG(ERROR) << "Reverse DFA inconsistency: "
                     << CEscape(regexp_str_)
                     << " on " << CEscape(text);
          result->matched = false;
        }
      }
      result->have_submatch0 = true;
      break;

    case kEngineOnePass:
      if (prog_ == NULL ||
          anchor == Prog::kUnanchored ||
          !prog_->IsOnePass() ||
          nsubmatch > Prog::kMaxOnePassCapture) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchOnePass(text, context, anchor, kind_,
                                      result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineBitState:
      if (prog_ == NULL) {
        result->skipped = true;
        break;
      }
      result->matched = prog_->SearchBitState(text, context, anchor, kind_,
                                              result->submatch, nsubmatch);
      result->have_submatch = true;
      break;

    case kEngineRE2:
    case kEngineRE2a:
    case kEngineRE2b: {
      if (!re2_ || text.end() != context.end()) {
        result->skipped = true;
        break;
      }

      RE2::Anchor re_anchor;
      if (anchor == Prog::kAnchored)
        re_anchor = RE2::ANCHOR_START;
      else
        re_anchor = RE2::UNANCHORED;
      if (kind_ == Prog::kFullMatch)
        re_anchor = RE2::ANCHOR_BOTH;

      result->matched = re2_->Match(
          context,
          static_cast<int>(text.begin() - context.begin()),
          static_cast<int>(text.end() - context.begin()),
          re_anchor,
          result->submatch,
          nsubmatch);
      result->have_submatch = nsubmatch > 0;
      break;
    }

    case kEnginePCRE: {
      if (!re_ || text.begin() != context.begin() ||
          text.end() != context.end()) {
        result->skipped = true;
        break;
      }

      // PCRE 8.34 or so started allowing vertical tab to match \s,
      // following a change made in Perl 5.18. RE2 does not.
      if ((regexp_str_.contains("\\s") || regexp_str_.contains("\\S")) &&
          text.contains("\v")) {
        result->skipped = true;
        break;
      }

      const PCRE::Arg **argptr = new const PCRE::Arg*[nsubmatch];
      PCRE::Arg *a = new PCRE::Arg[nsubmatch];
      for (int i = 0; i < nsubmatch; i++) {
        a[i] = PCRE::Arg(&result->submatch[i]);
        argptr[i] = &a[i];
      }
      int consumed;
      PCRE::Anchor pcre_anchor;
      if (anchor == Prog::kAnchored)
        pcre_anchor = PCRE::ANCHOR_START;
      else
        pcre_anchor = PCRE::UNANCHORED;
      if (kind_ == Prog::kFullMatch)
        pcre_anchor = PCRE::ANCHOR_BOTH;
      re_->ClearHitLimit();
      result->matched =
        re_->DoMatch(text,
                     pcre_anchor,
                     &consumed,
                     argptr, nsubmatch);
      if (re_->HitLimit()) {
        result->untrusted = true;
        delete[] argptr;
        delete[] a;
        break;
      }
      result->have_submatch = true;

      // Work around RE interface bug: PCRE returns -1 as the
      // offsets for an unmatched subexpression, and RE should
      // turn that into StringPiece(NULL) but in fact it uses
      // StringPiece(text.begin() - 1, 0).  Oops.
      for (int i = 0; i < nsubmatch; i++)
        if (result->submatch[i].begin() == text.begin() - 1)
          result->submatch[i] = NULL;
      delete[] argptr;
      delete[] a;
      break;
    }
  }

  if (!result->matched)
    memset(result->submatch, 0, sizeof result->submatch);
}